

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  uint8_t uVar1;
  _Bool _Var2;
  uint32_t base;
  array_container_t *cont;
  int i;
  long lVar3;
  long lVar4;
  
  for (lVar3 = 0; lVar4 = (long)(r->high_low_container).size, lVar3 < lVar4; lVar3 = lVar3 + 1) {
    cont = (array_container_t *)(r->high_low_container).containers[lVar3];
    uVar1 = (r->high_low_container).typecodes[lVar3];
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&cont->array;
      cont = *(array_container_t **)cont;
    }
    base = (uint)(r->high_low_container).keys[lVar3] << 0x10;
    if (uVar1 == '\x01') {
      _Var2 = bitset_container_iterate((bitset_container_t *)cont,base,iterator,ptr);
    }
    else if (uVar1 == '\x03') {
      _Var2 = run_container_iterate((run_container_t *)cont,base,iterator,ptr);
    }
    else {
      _Var2 = array_container_iterate(cont,base,iterator,ptr);
    }
    if (_Var2 == false) break;
  }
  return lVar4 <= lVar3;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16, iterator, ptr)) {
            return false;
        }
    return true;
}